

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::DataBuilderCollationIterator::getCE32FromBuilderData
          (DataBuilderCollationIterator *this,uint32_t ce32,UErrorCode *errorCode)

{
  int32_t c;
  uint32_t uVar1;
  ConditionalCE32 *head;
  char16_t *pcVar2;
  ConditionalCE32 *cond;
  UChar32 jamo;
  UErrorCode *errorCode_local;
  uint32_t ce32_local;
  DataBuilderCollationIterator *this_local;
  
  if ((ce32 & 0x100) == 0) {
    head = CollationDataBuilder::getConditionalCE32ForCE32(this->builder,ce32);
    if (head->builtCE32 == 1) {
      uVar1 = CollationDataBuilder::buildContext(this->builder,head,errorCode);
      head->builtCE32 = uVar1;
      if (*errorCode == U_BUFFER_OVERFLOW_ERROR) {
        *errorCode = U_ZERO_ERROR;
        CollationDataBuilder::clearContexts(this->builder);
        uVar1 = CollationDataBuilder::buildContext(this->builder,head,errorCode);
        head->builtCE32 = uVar1;
      }
      pcVar2 = UnicodeString::getBuffer(&this->builder->contexts);
      (this->builderData).contexts = pcVar2;
    }
    this_local._4_4_ = head->builtCE32;
  }
  else {
    c = Collation::indexFromCE32(ce32);
    this_local._4_4_ = utrie2_get32_63(this->builder->trie,c);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
DataBuilderCollationIterator::getCE32FromBuilderData(uint32_t ce32, UErrorCode &errorCode) {
    U_ASSERT(Collation::hasCE32Tag(ce32, Collation::BUILDER_DATA_TAG));
    if((ce32 & CollationDataBuilder::IS_BUILDER_JAMO_CE32) != 0) {
        UChar32 jamo = Collation::indexFromCE32(ce32);
        return utrie2_get32(builder.trie, jamo);
    } else {
        ConditionalCE32 *cond = builder.getConditionalCE32ForCE32(ce32);
        if(cond->builtCE32 == Collation::NO_CE32) {
            // Build the context-sensitive mappings into their runtime form and cache the result.
            cond->builtCE32 = builder.buildContext(cond, errorCode);
            if(errorCode == U_BUFFER_OVERFLOW_ERROR) {
                errorCode = U_ZERO_ERROR;
                builder.clearContexts();
                cond->builtCE32 = builder.buildContext(cond, errorCode);
            }
            builderData.contexts = builder.contexts.getBuffer();
        }
        return cond->builtCE32;
    }
}